

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

float dxx(qnode_ptr_t q,int x,int y,int z)

{
  int iVar1;
  param512_t *papVar2;
  float *pfVar3;
  kernel_t *pkVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  float fVar8;
  
  iVar5 = C.m;
  iVar6 = (C.m - (C.m >> 0x1f) & 0xfffffffeU) + q->ofst;
  iVar1 = q->res;
  papVar2 = q->param_ptr[z];
  piVar7 = &(*papVar2)[iVar1 * x + y].err;
  if ((((y < iVar6) || (x < iVar6)) || (q->sizy - iVar6 <= x)) || (q->sizx - iVar6 <= y)) {
    *piVar7 = 1;
    fVar8 = 0.0;
  }
  else {
    *piVar7 = 0;
    fVar8 = 0.0;
    if (-2 < iVar5) {
      iVar5 = iVar5 / 2;
      iVar6 = -iVar5;
      if (0 < iVar5) {
        iVar6 = iVar5;
      }
      pfVar3 = &(*papVar2)[((long)x - (long)iVar5) * (long)iVar1 + (long)y].fx;
      iVar5 = iVar5 + iVar6 + 1;
      pkVar4 = &C;
      do {
        fVar8 = fVar8 + *pfVar3 * pkVar4->k[0];
        pkVar4 = (kernel_t *)(pkVar4->k + 1);
        pfVar3 = pfVar3 + (long)iVar1 * 8;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    fVar8 = fVar8 / C.f;
  }
  return fVar8;
}

Assistant:

float dxx(q,x,y,z)
qnode_ptr_t q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,q->sizy,q->sizx,q->ofst,h,2)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[q->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*q->param_ptr[z])[q->res*(x+i) + y].fx*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}